

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O0

void extendResult(vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  *result,vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                          *contents)

{
  TextContent *this;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *pvVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  const_reference ppcVar5;
  size_t length;
  const_iterator __first;
  const_iterator __last;
  bool bVar6;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_80;
  const_iterator local_78;
  cmGeneratorExpressionEvaluator **local_68;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_60;
  __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_58;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_50;
  const_iterator local_48;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_40;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_38;
  TextContent *local_30;
  TextContent *textContent;
  __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
  local_20;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *local_18;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *contents_local;
  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
  *result_local;
  
  local_18 = contents;
  contents_local = result;
  bVar2 = std::
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          ::empty(result);
  bVar6 = false;
  if (!bVar2) {
    textContent = (TextContent *)
                  std::
                  vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  ::end(contents_local);
    local_20 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-((__normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                            *)&textContent,1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_20);
    iVar3 = (*(*ppcVar4)->_vptr_cmGeneratorExpressionEvaluator[2])();
    bVar6 = false;
    if (iVar3 == 0) {
      ppcVar5 = std::
                vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                ::front(local_18);
      iVar3 = (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[2])();
      bVar6 = iVar3 == 0;
    }
  }
  pvVar1 = contents_local;
  if (bVar6) {
    local_40._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    local_38 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator-(&local_40,1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluator_**,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
              ::operator*(&local_38);
    this = (TextContent *)*ppcVar4;
    local_30 = this;
    ppcVar5 = std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::front(local_18);
    length = TextContent::GetLength((TextContent *)*ppcVar5);
    TextContent::Extend(this,length);
    ppcVar5 = std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::front(local_18);
    if (*ppcVar5 != (value_type)0x0) {
      (*(*ppcVar5)->_vptr_cmGeneratorExpressionEvaluator[1])();
    }
    pvVar1 = contents_local;
    local_50._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
    ::__normal_iterator<cmGeneratorExpressionEvaluator**>
              ((__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
                *)&local_48,&local_50);
    local_60._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::begin(local_18);
    local_58 = __gnu_cxx::
               __normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
               ::operator+(&local_60,1);
    local_68 = (cmGeneratorExpressionEvaluator **)
               std::
               vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
               ::end(local_18);
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>,void>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)pvVar1,local_48,local_58,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )local_68);
  }
  else {
    local_80._M_current =
         (cmGeneratorExpressionEvaluator **)
         std::
         vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         ::end(contents_local);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
    ::__normal_iterator<cmGeneratorExpressionEvaluator**>
              ((__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>
                *)&local_78,&local_80);
    __first = std::
              vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
              ::begin(local_18);
    __last = std::
             vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
             ::end(local_18);
    std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
    insert<__gnu_cxx::__normal_iterator<cmGeneratorExpressionEvaluator*const*,std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>>,void>
              ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                *)pvVar1,local_78,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )__first._M_current,
               (__normal_iterator<cmGeneratorExpressionEvaluator_*const_*,_std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

static void extendResult(
  std::vector<cmGeneratorExpressionEvaluator*>& result,
  const std::vector<cmGeneratorExpressionEvaluator*>& contents)
{
  if (!result.empty() &&
      (*(result.end() - 1))->GetType() ==
        cmGeneratorExpressionEvaluator::Text &&
      contents.front()->GetType() == cmGeneratorExpressionEvaluator::Text) {
    TextContent* textContent = static_cast<TextContent*>(*(result.end() - 1));
    textContent->Extend(
      static_cast<TextContent*>(contents.front())->GetLength());
    delete contents.front();
    result.insert(result.end(), contents.begin() + 1, contents.end());
  } else {
    result.insert(result.end(), contents.begin(), contents.end());
  }
}